

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O1

void __thiscall Conversion::setVocab(Conversion *this,string *vocab)

{
  mapped_type *pmVar1;
  ulong uVar2;
  long lVar3;
  
  std::__cxx11::string::_M_assign((string *)this);
  if (vocab->_M_string_length != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      pmVar1 = std::
               map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>
               ::operator[](&this->charToIndex,(vocab->_M_dataplus)._M_p + uVar2);
      *pmVar1 = lVar3 >> 0x38;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x100000000000000;
    } while (uVar2 < vocab->_M_string_length);
  }
  return;
}

Assistant:

void Conversion::setVocab(string vocab) {
    this->indexToChar = vocab;
    for (int i = 0; i < vocab.size(); i++) {
        charToIndex[vocab[i]] = static_cast<char>(i);
    }
}